

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O1

void __thiscall ExprTest_HashPLTerm_Test::TestBody(ExprTest_HashPLTerm_Test *this)

{
  unsigned_long uVar1;
  bool bVar2;
  size_t sVar3;
  Reference arg;
  PLTerm expr;
  char *message;
  ulong uVar4;
  size_t i;
  long lVar5;
  size_t hash;
  AssertionResult gtest_ar;
  double breakpoints [2];
  double slopes [3];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertHelper local_78;
  unsigned_long local_70;
  hash<double> local_68 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  double local_58 [5];
  
  local_70 = 0x9e3779e1;
  local_58[0] = 5.0;
  local_58[1] = 10.0;
  local_58[2] = -1.0;
  local_58[3] = 0.0;
  local_58[4] = 1.0;
  lVar5 = 0;
  do {
    uVar1 = local_70;
    sVar3 = std::hash<double>::operator()(local_68,local_58[lVar5 + 2]);
    uVar4 = uVar1 * 0x40 + 0x9e3779b9 + (uVar1 >> 2) + sVar3 ^ uVar1;
    local_70 = uVar4;
    sVar3 = std::hash<double>::operator()(local_68,local_58[lVar5]);
    uVar4 = (uVar4 >> 2) + sVar3 + uVar4 * 0x40 + 0x9e3779b9 ^ uVar4;
    lVar5 = lVar5 + 1;
    local_70 = uVar4;
  } while (lVar5 == 1);
  sVar3 = std::hash<double>::operator()(local_68,local_58[4]);
  local_70 = uVar4 * 0x40 + 0x9e3779b9 + (uVar4 >> 2) + sVar3 ^ uVar4;
  arg = mp::BasicExprFactory<std::allocator<char>_>::MakeReference
                  (&(this->super_ExprTest).factory_,FIRST_REFERENCE,9);
  uVar1 = local_70;
  sVar3 = std::hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::operator()
                    ((hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *)local_68,
                     (Expr)arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.
                           impl_);
  local_70 = (uVar1 >> 2) + sVar3 + uVar1 * 0x40 + 0x9e3779b9 ^ uVar1;
  expr = ExprTest::MakePLTerm(&this->super_ExprTest,2,local_58,local_58 + 2,arg);
  local_80.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::operator()
                 ((hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *)&local_78,
                  (Expr)expr.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                        impl_);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_68,"hash",
             "ExprHash()( MakePLTerm(NUM_BREAKPOINTS, breakpoints, slopes, var))",&local_70,
             (unsigned_long *)&local_80);
  if (local_68[0] == (hash<double>)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x40b
               ,message);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_80.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_80.ptr_ + 8))();
      }
      local_80.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ExprTest, HashPLTerm) {
  size_t hash = HashCombine<int>(0, expr::PLTERM);
  enum {NUM_BREAKPOINTS = 2};
  double breakpoints[NUM_BREAKPOINTS] = {5, 10};
  double slopes[NUM_BREAKPOINTS + 1] = {-1, 0, 1};
  for (size_t i = 0; i < NUM_BREAKPOINTS; ++i) {
    hash = HashCombine(hash, slopes[i]);
    hash = HashCombine(hash, breakpoints[i]);
  }
  hash = HashCombine(hash, slopes[NUM_BREAKPOINTS]);
  auto var = factory_.MakeVariable(9);
  hash = HashCombine<Expr>(hash, var);
  EXPECT_EQ(hash, ExprHash()(
    MakePLTerm(NUM_BREAKPOINTS, breakpoints, slopes, var)));
}